

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

void stbtt_GetFontVMetrics(stbtt_fontinfo *info,int *ascent,int *descent,int *lineGap)

{
  if (ascent != (int *)0x0) {
    *ascent = (int)(short)((ushort)info->data[(long)info->hhea + 4] << 8) |
              (uint)info->data[(long)info->hhea + 5];
  }
  if (descent != (int *)0x0) {
    *descent = (int)(short)((ushort)info->data[(long)info->hhea + 6] << 8) |
               (uint)info->data[(long)info->hhea + 7];
  }
  if (lineGap != (int *)0x0) {
    *lineGap = (int)(short)((ushort)info->data[(long)info->hhea + 8] << 8) |
               (uint)info->data[(long)info->hhea + 9];
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_GetFontVMetrics(const stbtt_fontinfo *info, int *ascent, int *descent, int *lineGap)
{
   if (ascent ) *ascent  = ttSHORT(info->data+info->hhea + 4);
   if (descent) *descent = ttSHORT(info->data+info->hhea + 6);
   if (lineGap) *lineGap = ttSHORT(info->data+info->hhea + 8);
}